

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O1

JL_STATUS ProcessDictionaryOnStack
                    (ProcessStack *Stack,uint32_t *pStackDepth,JlBuffer *JsonBuffer,
                    JL_OUTPUT_FLAGS OutputFlags)

{
  ProcessStack *pPVar1;
  ProcessStack *pPVar2;
  uint32_t uVar3;
  JL_STATUS JVar4;
  uint uVar5;
  JL_DATA_TYPE JVar6;
  char *nextObjectKey;
  JlDataObject *nextObject;
  char *local_40;
  JlDataObject *local_38;
  
  pPVar1 = Stack + *pStackDepth;
  JVar4 = JL_STATUS_SUCCESS;
  if (pPVar1->StartedEnumerating == false) {
    JVar4 = OutputDictionaryStart(JsonBuffer,OutputFlags,*pStackDepth);
    pPVar1->StartedEnumerating = true;
    (pPVar1->field_4).ListEnumerator = (JlListItem *)0x0;
  }
  if (JVar4 == JL_STATUS_SUCCESS) {
    local_38 = (JlDataObject *)0x0;
    local_40 = (char *)0x0;
    JVar4 = JlGetObjectDictionaryNextItem
                      (pPVar1->Object,&local_38,&local_40,&(pPVar1->field_4).DictionaryEnumerator);
    if (JVar4 == JL_STATUS_END_OF_DATA) {
      if (((OutputFlags & 0x10) != 0) && (pPVar1->ProcessedFirstItem == true)) {
        JlBufferAdd(JsonBuffer,",",1);
      }
      JVar4 = OutputDictionaryEnd(JsonBuffer,OutputFlags,*pStackDepth);
      *pStackDepth = *pStackDepth - 1;
    }
    else if (JVar4 == JL_STATUS_SUCCESS) {
      uVar5 = *pStackDepth + 1;
      pPVar2 = Stack + uVar5;
      pPVar2->Object = (JlDataObject *)0x0;
      pPVar2->ObjectType = JL_DATA_TYPE_NONE;
      pPVar2->StartedEnumerating = false;
      pPVar2->ProcessedFirstItem = false;
      *(undefined2 *)&pPVar2->field_0xe = 0;
      Stack[uVar5].field_4.ListEnumerator = (JlListItem *)0x0;
      Stack[uVar5].Object = local_38;
      JVar6 = JlGetObjectType(local_38);
      Stack[uVar5].ObjectType = JVar6;
      uVar3 = *pStackDepth;
      *pStackDepth = uVar3 + 1;
      JVar4 = JL_STATUS_SUCCESS;
      if (pPVar1->ProcessedFirstItem == true) {
        JVar4 = OutputDictionaryBetween(JsonBuffer,OutputFlags,uVar3 + 1);
      }
      pPVar1->ProcessedFirstItem = true;
      if (JVar4 == JL_STATUS_SUCCESS) {
        JVar4 = OutputDictionaryKey(local_40,JsonBuffer,OutputFlags);
      }
    }
  }
  return JVar4;
}

Assistant:

JL_STATUS
    ProcessDictionaryOnStack
    (
        ProcessStack*       Stack,
        uint32_t*           pStackDepth,
        JlBuffer*           JsonBuffer,
        JL_OUTPUT_FLAGS     OutputFlags
    )
{
    JL_STATUS jlStatus;
    ProcessStack* currentItem = &Stack[*pStackDepth];

    jlStatus = JL_STATUS_SUCCESS;

    if( !currentItem->StartedEnumerating )
    {
        // Start a dictionary
        jlStatus = OutputDictionaryStart( JsonBuffer, OutputFlags, *pStackDepth );
        currentItem->StartedEnumerating = true;
        currentItem->DictionaryEnumerator = NULL;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Add next dictionary item to stack
        JlDataObject* nextObject = NULL;
        char const* nextObjectKey = NULL;
        jlStatus = JlGetObjectDictionaryNextItem( currentItem->Object, &nextObject, &nextObjectKey, &currentItem->DictionaryEnumerator );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Add item to stack
            ProcessStack* newItem = &Stack[*pStackDepth+1];
            memset( newItem, 0, sizeof(ProcessStack) );
            newItem->Object = nextObject;
            newItem->ObjectType = JlGetObjectType( nextObject );
            *pStackDepth += 1;

            if( currentItem->ProcessedFirstItem )
            {
                // Need to add a comma.
                jlStatus = OutputDictionaryBetween( JsonBuffer, OutputFlags, *pStackDepth );
            }
            currentItem->ProcessedFirstItem = true;

            // Output Key name
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputDictionaryKey( nextObjectKey, JsonBuffer, OutputFlags );
            }
        }
        else if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // End list
            if( OutputFlags & JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS && currentItem->ProcessedFirstItem )
            {
                // Add trailing comma
                (void) JlBufferAdd( JsonBuffer, ",", 1 );
            }
            jlStatus = OutputDictionaryEnd( JsonBuffer, OutputFlags, *pStackDepth );
            *pStackDepth -=1;
        }
    }

    return jlStatus;
}